

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O2

mz_bool mz_zip_writer_add_from_zip_reader
                  (mz_zip_archive *pZip,mz_zip_archive *pSource_zip,mz_uint file_index)

{
  mz_zip_internal_state *pArray;
  mz_zip_internal_state *pmVar1;
  mz_uint n;
  mz_bool mVar2;
  undefined4 uVar3;
  size_t sVar4;
  int *piVar5;
  size_t sVar6;
  ulong uVar7;
  uint uVar8;
  mz_uint8 *pmVar9;
  mz_uint64 mVar10;
  void *pvVar11;
  ulong uVar12;
  ulong local_b8;
  uint local_ac;
  mz_uint64 local_a8;
  mz_uint8 *local_a0;
  ulong local_98;
  ulong local_90;
  mz_uint32 local_header_u32 [8];
  mz_uint8 central_header [46];
  
  if (pZip == (mz_zip_archive *)0x0) {
    return 0;
  }
  pArray = pZip->m_pState;
  if (pArray == (mz_zip_internal_state *)0x0) {
    return 0;
  }
  if (pSource_zip == (mz_zip_archive *)0x0) {
    return 0;
  }
  if (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) {
    return 0;
  }
  pmVar1 = pSource_zip->m_pState;
  if (pmVar1 == (mz_zip_internal_state *)0x0) {
    return 0;
  }
  if (pSource_zip->m_total_files <= file_index) {
    return 0;
  }
  if (pSource_zip->m_zip_mode != MZ_ZIP_MODE_READING) {
    return 0;
  }
  pvVar11 = (pmVar1->m_central_dir).m_p;
  if (pvVar11 == (void *)0x0) {
    return 0;
  }
  uVar8 = *(uint *)((long)(pmVar1->m_central_dir_offsets).m_p + (ulong)file_index * 4);
  n = mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);
  if (pZip->m_total_files == 0xffff) {
    return 0;
  }
  local_a8 = pZip->m_archive_size;
  local_90 = (ulong)n;
  local_98 = local_a8 + local_90;
  if (local_98 - 0xffffffb4 < 0xffffffff00000000) {
    return 0;
  }
  pmVar9 = (mz_uint8 *)((long)pvVar11 + (ulong)uVar8);
  uVar8 = *(uint *)(pmVar9 + 0x2a);
  sVar4 = (*pSource_zip->m_pRead)(pSource_zip->m_pIO_opaque,(ulong)uVar8,local_header_u32,0x1e);
  if (sVar4 != 0x1e) {
    return 0;
  }
  if (local_header_u32[0] != 0x4034b50) {
    return 0;
  }
  mVar2 = mz_zip_writer_write_zeros(pZip,local_a8,n);
  if (mVar2 == 0) {
    return 0;
  }
  if ((pZip->m_file_offset_alignment != 0) && ((pZip->m_file_offset_alignment - 1 & local_98) != 0))
  {
    __assert_fail("(local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/contrib/zip/src/miniz.h"
                  ,0x198d,
                  "mz_bool mz_zip_writer_add_from_zip_reader(mz_zip_archive *, mz_zip_archive *, mz_uint)"
                 );
  }
  sVar4 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_98,local_header_u32,0x1e);
  if (sVar4 != 0x1e) {
    return 0;
  }
  uVar7 = (ulong)((uint)(ushort)local_header_u32[7] + (uint)local_header_u32[6]._2_2_ +
                 *(int *)(pmVar9 + 0x14));
  uVar12 = 0x10000;
  if (uVar7 < 0x10000) {
    uVar12 = uVar7;
  }
  sVar4 = 0x10;
  if (0x10 < uVar12) {
    sVar4 = uVar12;
  }
  local_a0 = pmVar9;
  piVar5 = (int *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,sVar4);
  if (piVar5 == (int *)0x0) {
    return 0;
  }
  local_b8 = local_a8 + local_90 + 0x1e;
  mVar10 = (ulong)uVar8 + 0x1e;
  for (; uVar7 != 0; uVar7 = uVar7 - sVar4) {
    sVar4 = 0x10000;
    if (uVar7 < 0x10000) {
      sVar4 = uVar7;
    }
    local_a8 = mVar10;
    sVar6 = (*pSource_zip->m_pRead)(pSource_zip->m_pIO_opaque,mVar10,piVar5,sVar4);
    if ((sVar6 != sVar4) ||
       (sVar6 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_b8,piVar5,sVar4), sVar6 != sVar4)) {
      pvVar11 = pZip->m_pAlloc_opaque;
      goto LAB_003a2677;
    }
    mVar10 = local_a8 + sVar4;
    local_b8 = local_b8 + sVar4;
  }
  if ((local_header_u32[1]._2_1_ & 8) != 0) {
    sVar4 = (*pSource_zip->m_pRead)(pSource_zip->m_pIO_opaque,mVar10,piVar5,0x10);
    if (sVar4 != 0x10) {
      pvVar11 = pZip->m_pAlloc_opaque;
LAB_003a2677:
      (*pZip->m_pFree)(pvVar11,piVar5);
      return 0;
    }
    local_ac = (uint)(*piVar5 == 0x8074b50) * 4 + 0xc;
    uVar12 = (ulong)local_ac;
    sVar4 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_b8,piVar5,uVar12);
    if (sVar4 != uVar12) {
      pvVar11 = pZip->m_pAlloc_opaque;
      goto LAB_003a2677;
    }
    local_b8 = local_b8 + uVar12;
  }
  (*pZip->m_pFree)(pZip->m_pAlloc_opaque,piVar5);
  if (local_b8 >> 0x20 != 0) {
    return 0;
  }
  sVar4 = (pArray->m_central_dir).m_size;
  central_header._0_8_ = *(undefined8 *)local_a0;
  central_header._8_8_ = *(undefined8 *)(local_a0 + 8);
  central_header._16_8_ = *(undefined8 *)(local_a0 + 0x10);
  central_header._32_6_ = (undefined6)((ulong)*(undefined8 *)(local_a0 + 0x1e) >> 0x10);
  central_header._24_6_ = (undefined6)*(undefined8 *)(local_a0 + 0x18);
  central_header._30_2_ = (undefined2)((ulong)*(undefined8 *)(local_a0 + 0x18) >> 0x30);
  uVar3 = (undefined4)local_98;
  central_header._38_4_ = (undefined4)*(undefined8 *)(local_a0 + 0x26);
  central_header[0x2a] = (char)uVar3;
  central_header[0x2b] = (char)((uint)uVar3 >> 8);
  central_header[0x2c] = (char)((uint)uVar3 >> 0x10);
  central_header[0x2d] = (char)((uint)uVar3 >> 0x18);
  uVar12 = sVar4 + 0x2e;
  if (((pArray->m_central_dir).m_capacity < uVar12) &&
     (mVar2 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar12,1), mVar2 == 0)) {
    return 0;
  }
  (pArray->m_central_dir).m_size = uVar12;
  uVar12 = (ulong)(pArray->m_central_dir).m_element_size;
  memcpy((void *)(sVar4 * uVar12 + (long)(pArray->m_central_dir).m_p),central_header,uVar12 * 0x2e);
  uVar8 = (uint)*(ushort *)(local_a0 + 0x20) +
          (uint)*(ushort *)(local_a0 + 0x1e) + (uint)*(ushort *)(local_a0 + 0x1c);
  if (uVar8 != 0) {
    sVar6 = (pArray->m_central_dir).m_size;
    uVar12 = sVar6 + uVar8;
    if (((pArray->m_central_dir).m_capacity < uVar12) &&
       (mVar2 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar12,1), mVar2 == 0))
    goto LAB_003a2869;
    (pArray->m_central_dir).m_size = uVar12;
    uVar12 = (ulong)(pArray->m_central_dir).m_element_size;
    memcpy((void *)(sVar6 * uVar12 + (long)(pArray->m_central_dir).m_p),local_a0 + 0x2e,
           uVar8 * uVar12);
  }
  if (*(int *)((long)&(pArray->m_central_dir).m_size + 4) != 0) {
    return 0;
  }
  local_ac = (uint)sVar4;
  sVar6 = (pArray->m_central_dir_offsets).m_size;
  uVar12 = sVar6 + 1;
  if ((uVar12 <= (pArray->m_central_dir_offsets).m_capacity) ||
     (mVar2 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir_offsets,uVar12,1), mVar2 != 0
     )) {
    (pArray->m_central_dir_offsets).m_size = uVar12;
    uVar12 = (ulong)(pArray->m_central_dir_offsets).m_element_size;
    memcpy((void *)(sVar6 * uVar12 + (long)(pArray->m_central_dir_offsets).m_p),&local_ac,uVar12);
    pZip->m_total_files = pZip->m_total_files + 1;
    pZip->m_archive_size = local_b8;
    return 1;
  }
LAB_003a2869:
  if (((pArray->m_central_dir).m_capacity < sVar4) &&
     (mVar2 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,sVar4,0), mVar2 == 0)) {
    return 0;
  }
  (pArray->m_central_dir).m_size = sVar4;
  return 0;
}

Assistant:

mz_bool mz_zip_writer_add_from_zip_reader(mz_zip_archive *pZip,
                                          mz_zip_archive *pSource_zip,
                                          mz_uint file_index) {
  mz_uint n, bit_flags, num_alignment_padding_bytes;
  mz_uint64 comp_bytes_remaining, local_dir_header_ofs;
  mz_uint64 cur_src_file_ofs, cur_dst_file_ofs;
  mz_uint32
      local_header_u32[(MZ_ZIP_LOCAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) /
                       sizeof(mz_uint32)];
  mz_uint8 *pLocal_header = (mz_uint8 *)local_header_u32;
  mz_uint8 central_header[MZ_ZIP_CENTRAL_DIR_HEADER_SIZE];
  size_t orig_central_dir_size;
  mz_zip_internal_state *pState;
  void *pBuf;
  const mz_uint8 *pSrc_central_header;

  if ((!pZip) || (!pZip->m_pState) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING))
    return MZ_FALSE;
  if (NULL ==
      (pSrc_central_header = mz_zip_reader_get_cdh(pSource_zip, file_index)))
    return MZ_FALSE;
  pState = pZip->m_pState;

  num_alignment_padding_bytes =
      mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);

  // no zip64 support yet
  if ((pZip->m_total_files == 0xFFFF) ||
      ((pZip->m_archive_size + num_alignment_padding_bytes +
        MZ_ZIP_LOCAL_DIR_HEADER_SIZE + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE) >
       0xFFFFFFFF))
    return MZ_FALSE;

  cur_src_file_ofs =
      MZ_READ_LE32(pSrc_central_header + MZ_ZIP_CDH_LOCAL_HEADER_OFS);
  cur_dst_file_ofs = pZip->m_archive_size;

  if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs,
                           pLocal_header, MZ_ZIP_LOCAL_DIR_HEADER_SIZE) !=
      MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
    return MZ_FALSE;
  if (MZ_READ_LE32(pLocal_header) != MZ_ZIP_LOCAL_DIR_HEADER_SIG)
    return MZ_FALSE;
  cur_src_file_ofs += MZ_ZIP_LOCAL_DIR_HEADER_SIZE;

  if (!mz_zip_writer_write_zeros(pZip, cur_dst_file_ofs,
                                 num_alignment_padding_bytes))
    return MZ_FALSE;
  cur_dst_file_ofs += num_alignment_padding_bytes;
  local_dir_header_ofs = cur_dst_file_ofs;
  if (pZip->m_file_offset_alignment) {
    MZ_ASSERT((local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) ==
              0);
  }

  if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_dst_file_ofs, pLocal_header,
                     MZ_ZIP_LOCAL_DIR_HEADER_SIZE) !=
      MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
    return MZ_FALSE;
  cur_dst_file_ofs += MZ_ZIP_LOCAL_DIR_HEADER_SIZE;

  n = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_FILENAME_LEN_OFS) +
      MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_EXTRA_LEN_OFS);
  comp_bytes_remaining =
      n + MZ_READ_LE32(pSrc_central_header + MZ_ZIP_CDH_COMPRESSED_SIZE_OFS);

  if (NULL ==
      (pBuf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1,
                             (size_t)MZ_MAX(sizeof(mz_uint32) * 4,
                                            MZ_MIN(MZ_ZIP_MAX_IO_BUF_SIZE,
                                                   comp_bytes_remaining)))))
    return MZ_FALSE;

  while (comp_bytes_remaining) {
    n = (mz_uint)MZ_MIN(MZ_ZIP_MAX_IO_BUF_SIZE, comp_bytes_remaining);
    if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pBuf,
                             n) != n) {
      pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
      return MZ_FALSE;
    }
    cur_src_file_ofs += n;

    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_dst_file_ofs, pBuf, n) != n) {
      pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
      return MZ_FALSE;
    }
    cur_dst_file_ofs += n;

    comp_bytes_remaining -= n;
  }

  bit_flags = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_BIT_FLAG_OFS);
  if (bit_flags & 8) {
    // Copy data descriptor
    if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pBuf,
                             sizeof(mz_uint32) * 4) != sizeof(mz_uint32) * 4) {
      pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
      return MZ_FALSE;
    }

    n = sizeof(mz_uint32) * ((MZ_READ_LE32(pBuf) == 0x08074b50) ? 4 : 3);
    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_dst_file_ofs, pBuf, n) != n) {
      pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
      return MZ_FALSE;
    }

    // cur_src_file_ofs += n;
    cur_dst_file_ofs += n;
  }
  pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);

  // no zip64 support yet
  if (cur_dst_file_ofs > 0xFFFFFFFF)
    return MZ_FALSE;

  orig_central_dir_size = pState->m_central_dir.m_size;

  memcpy(central_header, pSrc_central_header, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE);
  MZ_WRITE_LE32(central_header + MZ_ZIP_CDH_LOCAL_HEADER_OFS,
                local_dir_header_ofs);
  if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, central_header,
                              MZ_ZIP_CENTRAL_DIR_HEADER_SIZE))
    return MZ_FALSE;

  n = MZ_READ_LE16(pSrc_central_header + MZ_ZIP_CDH_FILENAME_LEN_OFS) +
      MZ_READ_LE16(pSrc_central_header + MZ_ZIP_CDH_EXTRA_LEN_OFS) +
      MZ_READ_LE16(pSrc_central_header + MZ_ZIP_CDH_COMMENT_LEN_OFS);
  if (!mz_zip_array_push_back(
          pZip, &pState->m_central_dir,
          pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE, n)) {
    mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size,
                        MZ_FALSE);
    return MZ_FALSE;
  }

  if (pState->m_central_dir.m_size > 0xFFFFFFFF)
    return MZ_FALSE;
  n = (mz_uint32)orig_central_dir_size;
  if (!mz_zip_array_push_back(pZip, &pState->m_central_dir_offsets, &n, 1)) {
    mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size,
                        MZ_FALSE);
    return MZ_FALSE;
  }

  pZip->m_total_files++;
  pZip->m_archive_size = cur_dst_file_ofs;

  return MZ_TRUE;
}